

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambda_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundLambdaExpression::Copy(BoundLambdaExpression *this)

{
  ExpressionType type_p;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  pointer pEVar2;
  _Head_base<0UL,_duckdb::BoundLambdaExpression_*,_false> this_00;
  pointer pBVar3;
  long in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_60;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  _Head_base<0UL,_duckdb::BoundLambdaExpression_*,_false> local_50;
  LogicalType local_48;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 0x58));
  (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_60,pEVar2);
  this_00._M_head_impl = (BoundLambdaExpression *)operator_new(0x80);
  type_p = *(ExpressionType *)(in_RSI + 8);
  LogicalType::LogicalType(&local_48,(LogicalType *)(in_RSI + 0x38));
  local_58 = local_60.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_60.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)(Expression *)0x0;
  BoundLambdaExpression
            (this_00._M_head_impl,type_p,&local_48,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_58,*(idx_t *)(in_RSI + 0x78));
  local_50._M_head_impl = this_00._M_head_impl;
  if (local_58._M_head_impl != (Expression *)0x0) {
    (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_58._M_head_impl = (Expression *)0x0;
  LogicalType::~LogicalType(&local_48);
  if (local_60.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
  {
    (**(code **)(*(long *)local_60.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                8))();
  }
  this_01 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
             (in_RSI + 0x60);
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            (in_RSI + 0x68);
  if (this_01 != puVar1) {
    do {
      pBVar3 = unique_ptr<duckdb::BoundLambdaExpression,_std::default_delete<duckdb::BoundLambdaExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundLambdaExpression,_std::default_delete<duckdb::BoundLambdaExpression>,_true>
                             *)&local_50);
      pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_48,pEVar2);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar3->captures,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_48);
      if ((Expression *)local_48._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_48._0_8_ + 8))();
      }
      this_01 = this_01 + 1;
      this_00._M_head_impl = local_50._M_head_impl;
    } while (this_01 != puVar1);
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)this_00._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundLambdaExpression::Copy() const {
	auto copy = make_uniq<BoundLambdaExpression>(type, return_type, lambda_expr->Copy(), parameter_count);
	for (auto &capture : captures) {
		copy->captures.push_back(capture->Copy());
	}
	return std::move(copy);
}